

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TempInputScalar
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *p_data,char *format,
               void *p_clamp_min,void *p_clamp_max)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ImGuiDataTypeInfo *pIVar4;
  int in_ECX;
  ImGuiID in_ESI;
  void *in_R8;
  ImGuiDataTypeTempStorage data_backup;
  size_t data_type_size;
  bool value_changed;
  ImGuiInputTextFlags flags;
  char data_buf [32];
  char fmt_buf [32];
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar5;
  ImGuiDataType in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  void *arg_1;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  void *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  ImGuiDataType in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  ImGuiInputTextFlags in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  ImGuiID in_stack_ffffffffffffffbc;
  ImRect *in_stack_ffffffffffffffc0;
  
  ImParseFormatTrimDecorations
            (in_stack_ffffffffffffff98,
             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (size_t)in_stack_ffffffffffffff88);
  DataTypeFormatString
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (void *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),(char *)0x1a4172)
  ;
  ImStrTrimBlanks((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  uVar5 = in_ECX == 8 || in_ECX == 9;
  uVar2 = 1;
  if (in_ECX == 8 || in_ECX == 9) {
    uVar2 = 0x20000;
  }
  uVar2 = uVar2 | 0x8000010;
  in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 & 0xffffff;
  bVar1 = TempInputText(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                        in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  if (bVar1) {
    pIVar4 = DataTypeGetInfo(in_ECX);
    arg_1 = (void *)pIVar4->Size;
    memcpy(&stack0xffffffffffffff70,in_R8,(size_t)arg_1);
    DataTypeApplyFromText
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
               (char *)CONCAT44(uVar2,in_stack_ffffffffffffff80));
    if ((data_backup.Data != (ImU8  [8])0x0) || (data_type_size != 0)) {
      if ((data_backup.Data != (ImU8  [8])0x0) &&
         ((data_type_size != 0 &&
          (iVar3 = DataTypeCompare(in_stack_ffffffffffffff80,arg_1,
                                   (void *)CONCAT44(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70)), 0 < iVar3)))) {
        ImSwap<void_const*>((void **)&data_backup,(void **)&data_type_size);
      }
      DataTypeClamp(in_stack_ffffffffffffff80,arg_1,
                    (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    (void *)CONCAT17(uVar5,in_stack_ffffffffffffff68));
    }
    iVar3 = memcmp(&stack0xffffffffffffff70,in_R8,(size_t)arg_1);
    in_stack_ffffffffffffff80 = (uint)(iVar3 != 0) << 0x18;
    if (iVar3 != 0) {
      MarkItemEdited(in_ESI);
    }
  }
  return (bool)((byte)(in_stack_ffffffffffffff80 >> 0x18) & 1);
}

Assistant:

bool ImGui::TempInputScalar(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* p_data, const char* format, const void* p_clamp_min, const void* p_clamp_max)
{
    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, p_data, format);
    ImStrTrimBlanks(data_buf);

    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited;
    flags |= ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = false;
    if (TempInputText(bb, id, label, data_buf, IM_ARRAYSIZE(data_buf), flags))
    {
        // Backup old value
        size_t data_type_size = DataTypeGetInfo(data_type)->Size;
        ImGuiDataTypeTempStorage data_backup;
        memcpy(&data_backup, p_data, data_type_size);

        // Apply new value (or operations) then clamp
        DataTypeApplyFromText(data_buf, data_type, p_data, NULL);
        if (p_clamp_min || p_clamp_max)
        {
            if (p_clamp_min && p_clamp_max && DataTypeCompare(data_type, p_clamp_min, p_clamp_max) > 0)
                ImSwap(p_clamp_min, p_clamp_max);
            DataTypeClamp(data_type, p_data, p_clamp_min, p_clamp_max);
        }

        // Only mark as edited if new value is different
        value_changed = memcmp(&data_backup, p_data, data_type_size) != 0;
        if (value_changed)
            MarkItemEdited(id);
    }
    return value_changed;
}